

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O1

h__TextParser * __thiscall
AS_02::TimedText::ST2052_TextParser::h__TextParser::ReadAncillaryResource
          (h__TextParser *this,byte_t *uuid,FrameBuffer *FrameBuf,IResourceResolver *Resolver)

{
  _func_int **pp_Var1;
  const_iterator cVar2;
  ILogSink *this_00;
  undefined8 uVar3;
  long *in_R8;
  UUID TmpID;
  char buf [64];
  long *local_b8 [2];
  long local_a8 [2];
  key_type local_98;
  char local_78 [72];
  
  pp_Var1 = *(_func_int ***)&FrameBuf->field_0x8;
  Resolver[5]._vptr_IResourceResolver = *(_func_int ***)FrameBuf;
  Resolver[6]._vptr_IResourceResolver = pp_Var1;
  local_98.super_Identifier<16U>.m_HasValue = true;
  local_98.super_Identifier<16U>.m_Value[0] = *(byte_t *)&FrameBuf->super_FrameBuffer;
  local_98.super_Identifier<16U>.m_Value[1] = FrameBuf->field_0x1;
  local_98.super_Identifier<16U>.m_Value[2] = FrameBuf->field_0x2;
  local_98.super_Identifier<16U>.m_Value[3] = FrameBuf->field_0x3;
  local_98.super_Identifier<16U>.m_Value[4] = FrameBuf->field_0x4;
  local_98.super_Identifier<16U>.m_Value[5] = FrameBuf->field_0x5;
  local_98.super_Identifier<16U>.m_Value[6] = FrameBuf->field_0x6;
  local_98.super_Identifier<16U>.m_Value[7] = FrameBuf->field_0x7;
  local_98.super_Identifier<16U>.m_Value[8] = FrameBuf->field_0x8;
  local_98.super_Identifier<16U>.m_Value[9] = FrameBuf->field_0x9;
  local_98.super_Identifier<16U>.m_Value[10] = FrameBuf->field_0xa;
  local_98.super_Identifier<16U>.m_Value[0xb] = FrameBuf->field_0xb;
  local_98.super_Identifier<16U>.m_Value[0xc] = FrameBuf->field_0xc;
  local_98.super_Identifier<16U>.m_Value[0xd] = FrameBuf->field_0xd;
  local_98.super_Identifier<16U>.m_Value[0xe] = FrameBuf->field_0xe;
  local_98.super_Identifier<16U>.m_Value[0xf] = FrameBuf->field_0xf;
  local_98.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0016d298;
  cVar2 = std::
          _Rb_tree<Kumu::UUID,_std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>,_std::_Select1st<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
          ::find((_Rb_tree<Kumu::UUID,_std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>,_std::_Select1st<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
                  *)(uuid + 0x80),&local_98);
  if (cVar2._M_node == (_Base_ptr)(uuid + 0x88)) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    uVar3 = Kumu::bin2UUIDhex(local_98.super_Identifier<16U>.m_Value,0x10,local_78,0x40);
    Kumu::ILogSink::Error(this_00,"Unknown ancillary resource id: %s\n",uVar3);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_RANGE);
  }
  else {
    (**(code **)(*in_R8 + 0x10))(this);
    if (-1 < *(int *)this) {
      local_b8[0] = local_a8;
      if (cVar2._M_node[2]._M_color == 2) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"application/x-font-opentype","");
        std::__cxx11::string::_M_assign((string *)(Resolver + 7));
      }
      else if (cVar2._M_node[2]._M_color == _S_black) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"image/png","");
        std::__cxx11::string::_M_assign((string *)(Resolver + 7));
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"application/octet-stream","");
        std::__cxx11::string::_M_assign((string *)(Resolver + 7));
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
    }
  }
  return this;
}

Assistant:

Result_t
AS_02::TimedText::ST2052_TextParser::h__TextParser::ReadAncillaryResource(const byte_t* uuid, ASDCP::TimedText::FrameBuffer& FrameBuf,
									  const ASDCP::TimedText::IResourceResolver& Resolver) const
{
  FrameBuf.AssetID(uuid);
  UUID TmpID(uuid);
  char buf[64];

  ResourceTypeMap_t::const_iterator rmi = m_ResourceTypes.find(TmpID);

  if ( rmi == m_ResourceTypes.end() )
    {
      DefaultLogSink().Error("Unknown ancillary resource id: %s\n", TmpID.EncodeHex(buf, 64));
      return RESULT_RANGE;
    }

  Result_t result = Resolver.ResolveRID(uuid, FrameBuf);

  if ( KM_SUCCESS(result) )
    {
      if ( (*rmi).second == ASDCP::TimedText::MT_PNG )
	{
	  FrameBuf.MIMEType("image/png");
	}    
      else if ( (*rmi).second == ASDCP::TimedText::MT_OPENTYPE )
	{
	  FrameBuf.MIMEType("application/x-font-opentype");
	}
      else
	{
	  FrameBuf.MIMEType("application/octet-stream");
	}
    }

  return result;
}